

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

Mat * ncnn::Mat::from_float16(unsigned_short *data,int size)

{
  int in_EDX;
  unsigned_short *in_RSI;
  Mat *in_RDI;
  bool bVar1;
  float fVar2;
  int remain;
  float *ptr;
  Mat *m;
  Allocator *in_stack_ffffffffffffff18;
  size_t in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff2c;
  Mat *pMVar3;
  int local_ac;
  float *local_a8;
  unsigned_short *local_88;
  
  in_RDI->data = (void *)0x0;
  in_RDI->refcount = (int *)0x0;
  in_RDI->elemsize = 0;
  in_RDI->elempack = 0;
  in_RDI->allocator = (Allocator *)0x0;
  in_RDI->dims = 0;
  in_RDI->w = 0;
  in_RDI->h = 0;
  in_RDI->d = 0;
  in_RDI->c = 0;
  in_RDI->cstep = 0;
  pMVar3 = in_RDI;
  create(in_RDI,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  bVar1 = true;
  if (in_RDI->data != (void *)0x0) {
    bVar1 = in_RDI->cstep * (long)in_RDI->c == 0;
  }
  if (!bVar1) {
    local_a8 = (float *)in_RDI->data;
    local_88 = in_RSI;
    for (local_ac = in_EDX; 0 < local_ac; local_ac = local_ac + -1) {
      fVar2 = float16_to_float32(*local_88);
      *local_a8 = fVar2;
      local_88 = local_88 + 1;
      local_a8 = local_a8 + 1;
    }
  }
  return pMVar3;
}

Assistant:

Mat Mat::from_float16(const unsigned short* data, int size)
{
    Mat m(size);
    if (m.empty())
        return m;

    float* ptr = m; //.data;

#if __ARM_NEON && (__ARM_FP & 2)
    int nn = cpu_support_arm_vfpv4() ? size >> 2 : 0;
    int remain = size - (nn << 2);
#else
    int remain = size;
#endif // __ARM_NEON

#if __ARM_NEON && (__ARM_FP & 2)
#if __aarch64__
    if (nn > 0)
    {
        asm volatile(
            "0:                             \n"
            "ld1    {v0.4h}, [%1], #8       \n"
            "fcvtl  v1.4s, v0.4h            \n"
            "subs   %w0, %w0, #1            \n"
            "st1    {v1.4s}, [%2], #16      \n"
            "bne    0b                      \n"
            : "=r"(nn),   // %0
            "=r"(data), // %1
            "=r"(ptr)   // %2
            : "0"(nn),
            "1"(data),
            "2"(ptr)
            : "cc", "memory", "v0", "v1");
    }
#else
    if (nn > 0)
    {
        asm volatile(
            "0:                             \n"
            "pld        [%1, #64]           \n"
            "vld1.s16   {d0}, [%1]!         \n"
            "vcvt.f32.f16 q1, d0            \n"
            "subs       %0, #1              \n"
            "vst1.f32   {d2-d3}, [%2 :128]! \n"
            "bne        0b                  \n"
            : "=r"(nn),   // %0
            "=r"(data), // %1
            "=r"(ptr)   // %2
            : "0"(nn),
            "1"(data),
            "2"(ptr)
            : "cc", "memory", "q0", "q1");
    }
#endif // __aarch64__
#endif // __ARM_NEON
    for (; remain > 0; remain--)
    {
        *ptr = float16_to_float32(*data);

        data++;
        ptr++;
    }

    return m;
}